

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsJacobianWRTStateSparsity
          (OptimalControlProblem *this,SparsityStructure *stateSparsity)

{
  ulong uVar1;
  bool bVar2;
  element_type *peVar3;
  size_t sVar4;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  long *in_RDI;
  ostringstream errorMsg;
  size_t j;
  size_t i_1;
  size_t cols;
  size_t rows;
  size_t i;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>
  *group;
  iterator __end2;
  iterator __begin2;
  ConstraintsGroupsMap *__range2;
  size_t offset;
  SparsityStructure *in_stack_fffffffffffffd68;
  SparsityStructure *in_stack_fffffffffffffd70;
  ostringstream *this_00;
  ConstraintsGroup *in_stack_fffffffffffffd78;
  SparsityStructure *in_stack_fffffffffffffd80;
  string local_250 [32];
  string local_230 [48];
  ostringstream local_200 [376];
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  NonZero local_68;
  NonZero local_58;
  ulong local_48;
  reference local_40;
  _Self local_38;
  _Self local_30;
  long local_28;
  long local_20;
  byte local_1;
  
  local_20 = 0;
  SparsityStructure::clear(in_stack_fffffffffffffd70);
  local_28 = *in_RDI + 0x28;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
                *)in_stack_fffffffffffffd68);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
              *)in_stack_fffffffffffffd68);
  do {
    bVar2 = std::operator!=(&local_30,&local_38);
    if (!bVar2) {
      SparsityStructure::operator=(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      local_1 = 1;
LAB_00301811:
      return (bool)(local_1 & 1);
    }
    local_40 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                            *)0x3013c8);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3013e1);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3013e9);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3013ff);
    bVar2 = ConstraintsGroup::constraintJacobianWRTStateSparsity
                      (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x301428);
    peVar3->hasStateJacobianSparsity = bVar2;
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x301446);
    if ((peVar3->hasStateJacobianSparsity & 1U) == 0) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(*in_RDI + 0x18));
      if (!bVar2) {
        this_00 = local_200;
        std::__cxx11::ostringstream::ostringstream(this_00);
        poVar5 = std::operator<<((ostream *)this_00,"The group ");
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3016a7);
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3016af);
        ConstraintsGroup::name_abi_cxx11_((ConstraintsGroup *)in_stack_fffffffffffffd68);
        poVar5 = std::operator<<(poVar5,local_230);
        std::operator<<(poVar5,
                        " has dense state jacobian and no dynamical system has been provided yet. Cannot determine the sparsity since the state dimension is unknown."
                       );
        std::__cxx11::string::~string(local_230);
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("OptimalControlProblem","constraintJacobianWRTStateSparsity",pcVar6);
        std::__cxx11::string::~string(local_250);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_200);
        goto LAB_00301811;
      }
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x301595);
      local_70 = iDynTree::MatrixDynSize::rows();
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3015ba);
      local_78 = iDynTree::MatrixDynSize::cols();
      for (local_80 = 0; local_80 < local_70; local_80 = local_80 + 1) {
        for (local_88 = 0; local_88 < local_78; local_88 = local_88 + 1) {
          SparsityStructure::add
                    (in_stack_fffffffffffffd80,(size_t)in_stack_fffffffffffffd78,
                     (size_t)in_stack_fffffffffffffd70);
        }
      }
    }
    else {
      local_48 = 0;
      while( true ) {
        uVar1 = local_48;
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x30147d);
        sVar4 = SparsityStructure::size((SparsityStructure *)0x30148c);
        if (sVar4 <= uVar1) break;
        in_stack_fffffffffffffd80 = (SparsityStructure *)(*in_RDI + 0xd0);
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3014c1);
        local_58 = SparsityStructure::operator[]
                             (in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x30150e);
        local_68 = SparsityStructure::operator[]
                             (in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
        SparsityStructure::add
                  (in_stack_fffffffffffffd80,(size_t)in_stack_fffffffffffffd78,
                   (size_t)in_stack_fffffffffffffd70);
        local_48 = local_48 + 1;
      }
    }
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3017bf);
    lVar7 = iDynTree::MatrixDynSize::rows();
    local_20 = lVar7 + local_20;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                  *)in_stack_fffffffffffffd70);
  } while( true );
}

Assistant:

bool OptimalControlProblem::constraintsJacobianWRTStateSparsity(SparsityStructure &stateSparsity)
        {
            size_t offset = 0;
            m_pimpl->stateJacobianSparsity.clear();
            for (auto& group : m_pimpl->constraintsGroups){

                group.second->hasStateJacobianSparsity = group.second->group_ptr->constraintJacobianWRTStateSparsity(group.second->stateJacobianSparsity);

                if (group.second->hasStateJacobianSparsity) {

                    for (size_t i = 0; i < group.second->stateJacobianSparsity.size(); ++i) {
                        m_pimpl->stateJacobianSparsity.add(group.second->stateJacobianSparsity[i].row + offset,
                                                           group.second->stateJacobianSparsity[i].col);
                    }

                } else {

                    if (m_pimpl->dynamicalSystem) {

                        size_t rows = group.second->stateJacobianBuffer.rows();
                        size_t cols = group.second->stateJacobianBuffer.cols();

                        for (size_t i = 0; i < rows; ++i) {
                            for (size_t j = 0; j < cols; ++j) {
                                m_pimpl->stateJacobianSparsity.add(i + offset, j);
                            }
                        }
                    } else {
                        std::ostringstream errorMsg;
                        errorMsg << "The group " << group.second->group_ptr->name() <<" has dense state jacobian and no dynamical system has been provided yet. Cannot determine the sparsity since the state dimension is unknown.";
                        reportError("OptimalControlProblem", "constraintJacobianWRTStateSparsity", errorMsg.str().c_str());
                        return false;
                    }
                }

                offset += group.second->stateJacobianBuffer.rows();
            }

            stateSparsity = m_pimpl->stateJacobianSparsity;

            return true;
        }